

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationAngle.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationAngle::Update
          (ChLinkMotorRotationAngle *this,double mytime,bool update_assets)

{
  ChFrame<double> *Fb;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *pgVar1;
  DstXprType **ppDVar2;
  Index index;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ChMatrix33<double> Jw2;
  ChMatrix33<double> Jw1;
  ChQuaternion<double> q;
  ChMatrix33<double> mtempQ;
  ChMatrix33<double> abs_plane_rotating;
  ChStarMatrix33<double> mtempM;
  ChFrame<double> aframe1;
  ChFrame<double> aframe2;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *local_488;
  ChMatrix33<double> *local_480;
  ulong local_478;
  ChMatrix33<double> local_468;
  DstXprType local_418;
  ChFrame<double> local_3c8;
  ChMatrix33<double> local_338;
  ChQuaternion<double> local_2e8;
  double dStack_2c8;
  double dStack_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double local_2a8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_298;
  DstEvaluatorType *local_278;
  ulong local_270;
  ulong uStack_268;
  double local_260;
  DstEvaluatorType *local_258;
  ChFrame<double> local_250;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  ChLinkMotorRotation::Update(&this->super_ChLinkMotorRotation,mytime,update_assets);
  Fb = (ChFrame<double> *)
       (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
       super_ChLink.Body1;
  if ((Fb != (ChFrame<double> *)0x0) &&
     ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
      super_ChLink.Body2 != (ChBodyFrame *)0x0)) {
    ChFrame<double>::operator>>
              (&local_140,
               &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame1,
               Fb);
    ChFrame<double>::operator>>
              (&local_b8,
               &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame2,
               (ChFrame<double> *)
               (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2);
    local_250._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
    local_250.coord.pos.m_data[0] = 0.0;
    local_250.coord.pos.m_data[1] = 0.0;
    local_250.coord.pos.m_data[2] = 0.0;
    local_1c8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_1c8.coord.pos.m_data[0] = 0.0;
    local_1c8.coord.pos.m_data[1] = 0.0;
    local_1c8.coord.pos.m_data[2] = 0.0;
    local_1c8.coord.rot.m_data[0] = 1.0;
    local_1c8.coord.rot.m_data[1] = 0.0;
    local_1c8.coord.rot.m_data[2] = 0.0;
    local_1c8.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_1c8.Amatrix,(ChQuaternion<double> *)&local_250);
    ChFrame<double>::TransformParentToLocal(&local_b8,&local_140,&local_1c8);
    local_3c8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
    local_3c8.coord.pos.m_data[0] = 0.0;
    local_3c8.coord.pos.m_data[1] = 0.0;
    local_3c8.coord.pos.m_data[2] = 0.0;
    local_250._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_250.coord.pos.m_data[0] = 0.0;
    local_250.coord.pos.m_data[1] = 0.0;
    local_250.coord.pos.m_data[2] = 0.0;
    local_250.coord.rot.m_data[0] = 1.0;
    local_250.coord.rot.m_data[1] = 0.0;
    local_250.coord.rot.m_data[2] = 0.0;
    local_250.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_250.Amatrix,(ChQuaternion<double> *)&local_3c8);
    (*((this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
       super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction
      [4])();
    Q_from_AngAxis(&local_2e8,mytime + *(double *)&(this->super_ChLinkMotorRotation).field_0x278,
                   (ChVector<double> *)&VECT_Z);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_b8.coord.rot.m_data[0];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_b8.coord.rot.m_data[1];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_2e8.m_data[0];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_2e8.m_data[1];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_2e8.m_data[1] * local_b8.coord.rot.m_data[1];
    auVar13 = vfmsub231sd_fma(auVar18,auVar11,auVar14);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_b8.coord.rot.m_data[2];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_2e8.m_data[2];
    auVar13 = vfnmadd231sd_fma(auVar13,auVar19,auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_b8.coord.rot.m_data[3];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_2e8.m_data[3];
    auVar16 = vfnmadd231sd_fma(auVar13,auVar22,auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_2e8.m_data[0] * local_b8.coord.rot.m_data[1];
    auVar13 = vfmadd231sd_fma(auVar24,auVar11,auVar17);
    auVar13 = vfnmadd231sd_fma(auVar13,auVar22,auVar21);
    auVar13 = vfmadd231sd_fma(auVar13,auVar19,auVar23);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_2e8.m_data[0] * local_b8.coord.rot.m_data[2];
    auVar14 = vfmadd231sd_fma(auVar25,auVar11,auVar21);
    auVar14 = vfmadd231sd_fma(auVar14,auVar22,auVar17);
    auVar18 = vfnmadd231sd_fma(auVar14,auVar12,auVar23);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_2e8.m_data[0] * local_b8.coord.rot.m_data[3];
    auVar14 = vfmadd231sd_fma(auVar15,auVar11,auVar23);
    auVar14 = vfnmadd231sd_fma(auVar14,auVar19,auVar17);
    auVar14 = vfmadd231sd_fma(auVar14,auVar12,auVar21);
    local_3c8._vptr_ChFrame = auVar16._0_8_;
    local_3c8.coord.pos.m_data[0] = auVar13._0_8_;
    local_3c8.coord.pos.m_data[1] = auVar18._0_8_;
    local_3c8.coord.pos.m_data[2] = auVar14._0_8_;
    ChFrame<double>::SetRot(&local_250,(ChQuaternion<double> *)&local_3c8);
    local_2e8.m_data[0] = 1.0;
    local_2e8.m_data[1] = 0.0;
    local_2e8.m_data[2] = 0.0;
    local_2e8.m_data[3] = 0.0;
    local_3c8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_3c8.coord.pos.m_data[0] = 0.0;
    local_3c8.coord.pos.m_data[1] = 0.0;
    local_3c8.coord.pos.m_data[2] = 0.0;
    local_3c8.coord.rot.m_data[0] = 1.0;
    local_3c8.coord.rot.m_data[1] = 0.0;
    local_3c8.coord.rot.m_data[2] = 0.0;
    local_3c8.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_3c8.Amatrix,&local_2e8);
    ChFrame<double>::TransformParentToLocal(&local_250,&local_140,&local_3c8);
    local_2a8 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
    local_2e8.m_data[0] =
         local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_2e8.m_data[1] =
         local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_2e8.m_data[2] =
         local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_2e8.m_data[3] =
         local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    dStack_2c8 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    dStack_2c0 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    dStack_2b8 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
    dStack_2b0 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                    super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
                  super_ChFrame<double>.Amatrix;
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         1.48219693752374e-323;
    local_298.m_dst = (DstEvaluatorType *)&local_338;
    local_298.m_functor = (assign_op<double,_double> *)&local_488;
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_2e8;
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)&local_2e8;
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_418;
    local_298.m_src = (SrcEvaluatorType *)&local_468;
    local_298.m_dstExpr = &local_418;
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
    ::run(&local_298);
    local_298.m_functor =
         (assign_op<double,_double> *)
         &(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).super_ChFrame<double>
          .Amatrix;
    local_298.m_dst = (DstEvaluatorType *)&local_2e8;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_468,
               (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_298);
    local_260 = local_3c8.coord.rot.m_data[1] * 0.5;
    local_298.m_functor = (assign_op<double,_double> *)(local_3c8.coord.rot.m_data[2] * 0.5);
    local_298.m_dstExpr = (DstXprType *)(local_3c8.coord.rot.m_data[3] * 0.5);
    auVar20._0_8_ = -(double)local_298.m_dstExpr;
    auVar20._8_8_ = 0x8000000000000000;
    local_298.m_src = (SrcEvaluatorType *)vmovlpd_avx(auVar20);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_260;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_298.m_functor;
    auVar13 = vunpcklpd_avx(auVar13,auVar16);
    local_270 = auVar13._0_8_ ^ 0x8000000000000000;
    uStack_268 = auVar13._8_8_ ^ 0x8000000000000000;
    local_298.m_dst = (DstEvaluatorType *)(local_3c8.coord.rot.m_data[0] * 0.5);
    local_488 = &local_298;
    local_480 = (ChMatrix33<double> *)&local_418;
    local_278 = local_298.m_dst;
    local_258 = local_298.m_dst;
    ChMatrix33<double>::operator=
              (&local_338,
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_488);
    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
         = local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
         = local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
         = local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
         = local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
         = local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
         = local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
         = local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    local_488 = &local_298;
    local_480 = &local_468;
    ChMatrix33<double>::operator=
              (&local_338,
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_488);
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    uVar10 = (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_z +
             (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_y +
             (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_x;
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rx == true) {
      uVar4 = (ulong)(uVar10 & 0xff);
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
          (long)uVar4) goto LAB_005c40e6;
      (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar4] =
           local_3c8.coord.rot.m_data[1];
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr
          <= (int)uVar10) goto LAB_005c4086;
      (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                          super_ChLinkMateGeneric.mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_488);
      uVar3 = local_478;
      pgVar1 = local_488;
      if ((long)local_478 < 0) goto LAB_005c40a8;
      uVar5 = local_478;
      if ((((ulong)local_488 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)local_488 >> 3) & 0x1fffffff) & 7),
         (long)local_478 <= (long)uVar5)) {
        uVar5 = local_478;
      }
      uVar9 = local_478 - uVar5;
      uVar7 = uVar9 + 7;
      if (-1 < (long)uVar9) {
        uVar7 = uVar9;
      }
      if (0 < (long)uVar5) {
        memset(local_488,0,uVar5 * 8);
      }
      lVar8 = (uVar7 & 0xfffffffffffffff8) + uVar5;
      if (7 < (long)uVar9) {
        lVar6 = uVar5 + 8;
        if ((long)(uVar5 + 8) < lVar8) {
          lVar6 = lVar8;
        }
        memset(&pgVar1->m_dst + uVar5,0,(~uVar5 + lVar6 & 0xfffffffffffffff8) * 8 + 0x40);
      }
      lVar6 = uVar3 - lVar8;
      if (lVar6 != 0 && lVar8 <= (long)uVar3) {
        memset(&pgVar1[((long)uVar7 >> 3) * 2].m_dst + uVar5,0,lVar6 * 8);
      }
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr
          <= (int)uVar10) goto LAB_005c4086;
      (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                          super_ChLinkMateGeneric.mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_488);
      uVar3 = local_478;
      pgVar1 = local_488;
      if ((long)local_478 < 0) goto LAB_005c40a8;
      uVar5 = local_478;
      if ((((ulong)local_488 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)local_488 >> 3) & 0x1fffffff) & 7),
         (long)local_478 <= (long)uVar5)) {
        uVar5 = local_478;
      }
      uVar9 = local_478 - uVar5;
      uVar7 = uVar9 + 7;
      if (-1 < (long)uVar9) {
        uVar7 = uVar9;
      }
      if (0 < (long)uVar5) {
        memset(local_488,0,uVar5 * 8);
      }
      lVar8 = (uVar7 & 0xfffffffffffffff8) + uVar5;
      if (7 < (long)uVar9) {
        lVar6 = uVar5 + 8;
        if ((long)(uVar5 + 8) < lVar8) {
          lVar6 = lVar8;
        }
        memset(&pgVar1->m_dst + uVar5,0,(~uVar5 + lVar6 & 0xfffffffffffffff8) * 8 + 0x40);
      }
      lVar6 = uVar3 - lVar8;
      if (lVar6 != 0 && lVar8 <= (long)uVar3) {
        memset(&pgVar1[((long)uVar7 >> 3) * 2].m_dst + uVar5,0,lVar6 * 8);
      }
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr
          <= (int)uVar10) goto LAB_005c4086;
      (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                          super_ChLinkMateGeneric.mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_488);
      if ((long)local_478 < 6) goto LAB_005c40c7;
      ppDVar2 = &local_488->m_dstExpr;
      uVar3 = 3;
      if ((((ulong)ppDVar2 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)ppDVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
        uVar3 = uVar5;
      }
      if (uVar3 != 0) {
        uVar5 = 0;
        do {
          ppDVar2[uVar5] =
               (DstXprType *)
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
      if (uVar3 < 3) {
        do {
          ppDVar2[uVar3] =
               (DstXprType *)
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 != 3);
      }
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr
          <= (int)uVar10) goto LAB_005c4086;
      (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                          super_ChLinkMateGeneric.mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_488);
      if ((long)local_478 < 6) goto LAB_005c40c7;
      ppDVar2 = &local_488->m_dstExpr;
      uVar4 = 3;
      if ((((ulong)ppDVar2 & 7) == 0) &&
         (uVar3 = (ulong)(-((uint)((ulong)ppDVar2 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
        uVar4 = uVar3;
      }
      if (uVar4 != 0) {
        uVar3 = 0;
        do {
          ppDVar2[uVar3] =
               (DstXprType *)
               local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      if (uVar4 < 3) {
        do {
          ppDVar2[uVar4] =
               (DstXprType *)
               local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      uVar10 = uVar10 + 1;
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_ry == true) {
      uVar4 = (ulong)uVar10;
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
          (long)uVar4) goto LAB_005c40e6;
      (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar4] =
           local_3c8.coord.rot.m_data[2];
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr
          <= (int)uVar10) goto LAB_005c4086;
      (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                          super_ChLinkMateGeneric.mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_488);
      uVar3 = local_478;
      pgVar1 = local_488;
      if ((long)local_478 < 0) goto LAB_005c40a8;
      uVar5 = local_478;
      if ((((ulong)local_488 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)local_488 >> 3) & 0x1fffffff) & 7),
         (long)local_478 <= (long)uVar5)) {
        uVar5 = local_478;
      }
      uVar9 = local_478 - uVar5;
      uVar7 = uVar9 + 7;
      if (-1 < (long)uVar9) {
        uVar7 = uVar9;
      }
      if (0 < (long)uVar5) {
        memset(local_488,0,uVar5 * 8);
      }
      lVar8 = (uVar7 & 0xfffffffffffffff8) + uVar5;
      if (7 < (long)uVar9) {
        lVar6 = uVar5 + 8;
        if ((long)(uVar5 + 8) < lVar8) {
          lVar6 = lVar8;
        }
        memset(&pgVar1->m_dst + uVar5,0,(~uVar5 + lVar6 & 0xfffffffffffffff8) * 8 + 0x40);
      }
      lVar6 = uVar3 - lVar8;
      if (lVar6 != 0 && lVar8 <= (long)uVar3) {
        memset(&pgVar1[((long)uVar7 >> 3) * 2].m_dst + uVar5,0,lVar6 * 8);
      }
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr
          <= (int)uVar10) goto LAB_005c4086;
      (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                          super_ChLinkMateGeneric.mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_488);
      uVar3 = local_478;
      pgVar1 = local_488;
      if ((long)local_478 < 0) goto LAB_005c40a8;
      uVar5 = local_478;
      if ((((ulong)local_488 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)local_488 >> 3) & 0x1fffffff) & 7),
         (long)local_478 <= (long)uVar5)) {
        uVar5 = local_478;
      }
      uVar9 = local_478 - uVar5;
      uVar7 = uVar9 + 7;
      if (-1 < (long)uVar9) {
        uVar7 = uVar9;
      }
      if (0 < (long)uVar5) {
        memset(local_488,0,uVar5 * 8);
      }
      lVar8 = (uVar7 & 0xfffffffffffffff8) + uVar5;
      if (7 < (long)uVar9) {
        lVar6 = uVar5 + 8;
        if ((long)(uVar5 + 8) < lVar8) {
          lVar6 = lVar8;
        }
        memset(&pgVar1->m_dst + uVar5,0,(~uVar5 + lVar6 & 0xfffffffffffffff8) * 8 + 0x40);
      }
      lVar6 = uVar3 - lVar8;
      if (lVar6 != 0 && lVar8 <= (long)uVar3) {
        memset(&pgVar1[((long)uVar7 >> 3) * 2].m_dst + uVar5,0,lVar6 * 8);
      }
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr
          <= (int)uVar10) goto LAB_005c4086;
      (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                          super_ChLinkMateGeneric.mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x88))(&local_488);
      if ((long)local_478 < 6) goto LAB_005c40c7;
      ppDVar2 = &local_488->m_dstExpr;
      uVar3 = 3;
      if ((((ulong)ppDVar2 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)ppDVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
        uVar3 = uVar5;
      }
      if (uVar3 != 0) {
        uVar5 = 0;
        do {
          ppDVar2[uVar5] =
               (DstXprType *)
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[uVar5 + 3];
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
      if (uVar3 < 3) {
        do {
          ppDVar2[uVar3] =
               (DstXprType *)
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[uVar3 + 3];
          uVar3 = uVar3 + 1;
        } while (uVar3 != 3);
      }
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr
          <= (int)uVar10) goto LAB_005c4086;
      (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                          super_ChLinkMateGeneric.mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo).
                         super_ChConstraint._vptr_ChConstraint + 0x90))(&local_488);
      if ((long)local_478 < 6) goto LAB_005c40c7;
      ppDVar2 = &local_488->m_dstExpr;
      uVar4 = 3;
      if ((((ulong)ppDVar2 & 7) == 0) &&
         (uVar3 = (ulong)(-((uint)((ulong)ppDVar2 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
        uVar4 = uVar3;
      }
      if (uVar4 != 0) {
        uVar3 = 0;
        do {
          ppDVar2[uVar3] =
               (DstXprType *)
               local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar3 + 3];
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      if (uVar4 < 3) {
        do {
          ppDVar2[uVar4] =
               (DstXprType *)
               local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [uVar4 + 3];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      uVar10 = uVar10 + 1;
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rz == true) {
      uVar4 = (ulong)uVar10;
      if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
          (long)uVar4) {
LAB_005c40e6:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
                     );
      }
      (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar4] =
           local_3c8.coord.rot.m_data[3];
      if ((int)uVar10 <
          (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr)
      {
        (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                            super_ChLinkMateGeneric.mask.constraints.
                            super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo)
                           .super_ChConstraint._vptr_ChConstraint + 0x88))(&local_488);
        uVar3 = local_478;
        pgVar1 = local_488;
        if ((long)local_478 < 0) {
LAB_005c40a8:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, 1, -1>]"
                       );
        }
        uVar5 = local_478;
        if ((((ulong)local_488 & 7) == 0) &&
           (uVar5 = (ulong)(-((uint)((ulong)local_488 >> 3) & 0x1fffffff) & 7),
           (long)local_478 <= (long)uVar5)) {
          uVar5 = local_478;
        }
        uVar9 = local_478 - uVar5;
        uVar7 = uVar9 + 7;
        if (-1 < (long)uVar9) {
          uVar7 = uVar9;
        }
        if (0 < (long)uVar5) {
          memset(local_488,0,uVar5 * 8);
        }
        lVar8 = (uVar7 & 0xfffffffffffffff8) + uVar5;
        if (7 < (long)uVar9) {
          lVar6 = uVar5 + 8;
          if ((long)(uVar5 + 8) < lVar8) {
            lVar6 = lVar8;
          }
          memset(&pgVar1->m_dst + uVar5,0,(~uVar5 + lVar6 & 0xfffffffffffffff8) * 8 + 0x40);
        }
        lVar6 = uVar3 - lVar8;
        if (lVar6 != 0 && lVar8 <= (long)uVar3) {
          memset(&pgVar1[((long)uVar7 >> 3) * 2].m_dst + uVar5,0,lVar6 * 8);
        }
        if ((int)uVar10 <
            (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr
           ) {
          (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                              super_ChLinkMateGeneric.mask.constraints.
                              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar4]->
                             super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x90))
                    (&local_488);
          uVar3 = local_478;
          pgVar1 = local_488;
          if ((long)local_478 < 0) goto LAB_005c40a8;
          uVar5 = local_478;
          if ((((ulong)local_488 & 7) == 0) &&
             (uVar5 = (ulong)(-((uint)((ulong)local_488 >> 3) & 0x1fffffff) & 7),
             (long)local_478 <= (long)uVar5)) {
            uVar5 = local_478;
          }
          uVar9 = local_478 - uVar5;
          uVar7 = uVar9 + 7;
          if (-1 < (long)uVar9) {
            uVar7 = uVar9;
          }
          if (0 < (long)uVar5) {
            memset(local_488,0,uVar5 * 8);
          }
          lVar8 = (uVar7 & 0xfffffffffffffff8) + uVar5;
          if (7 < (long)uVar9) {
            lVar6 = uVar5 + 8;
            if ((long)(uVar5 + 8) < lVar8) {
              lVar6 = lVar8;
            }
            memset(&pgVar1->m_dst + uVar5,0,(~uVar5 + lVar6 & 0xfffffffffffffff8) * 8 + 0x40);
          }
          lVar6 = uVar3 - lVar8;
          if (lVar6 != 0 && lVar8 <= (long)uVar3) {
            memset(&pgVar1[((long)uVar7 >> 3) * 2].m_dst + uVar5,0,lVar6 * 8);
          }
          if ((int)uVar10 <
              (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.
              nconstr) {
            (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                                super_ChLinkMateGeneric.mask.constraints.
                                super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar4]->
                               super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x88))
                      (&local_488);
            if (5 < (long)local_478) {
              ppDVar2 = &local_488->m_dstExpr;
              uVar3 = 3;
              if ((((ulong)ppDVar2 & 7) == 0) &&
                 (uVar5 = (ulong)(-((uint)((ulong)ppDVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
                uVar3 = uVar5;
              }
              if (uVar3 != 0) {
                uVar5 = 0;
                do {
                  ppDVar2[uVar5] =
                       (DstXprType *)
                       local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[uVar5 + 6];
                  uVar5 = uVar5 + 1;
                } while (uVar3 != uVar5);
              }
              if (uVar3 < 3) {
                do {
                  ppDVar2[uVar3] =
                       (DstXprType *)
                       local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[uVar3 + 6];
                  uVar3 = uVar3 + 1;
                } while (uVar3 != 3);
              }
              if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.
                  nconstr <= (int)uVar10) goto LAB_005c4086;
              (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.
                                  super_ChLinkMateGeneric.mask.constraints.
                                  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar4]->
                                 super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 0x90
                          ))(&local_488);
              if (5 < (long)local_478) {
                ppDVar2 = &local_488->m_dstExpr;
                uVar4 = 3;
                if ((((ulong)ppDVar2 & 7) == 0) &&
                   (uVar3 = (ulong)(-((uint)((ulong)ppDVar2 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
                  uVar4 = uVar3;
                }
                if (uVar4 != 0) {
                  uVar3 = 0;
                  do {
                    ppDVar2[uVar3] =
                         (DstXprType *)
                         local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[uVar3 + 6];
                    uVar3 = uVar3 + 1;
                  } while (uVar4 != uVar3);
                }
                if (2 < uVar4) {
                  return;
                }
                do {
                  ppDVar2[uVar4] =
                       (DstXprType *)
                       local_468.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[uVar4 + 6];
                  uVar4 = uVar4 + 1;
                } while (uVar4 != 3);
                return;
              }
            }
LAB_005c40c7:
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                          "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                         );
          }
        }
      }
LAB_005c4086:
      __assert_fail("(i >= 0) && (i < nconstr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                    ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
    }
  }
  return;
}

Assistant:

void ChLinkMotorRotationAngle::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorRotation::Update(mytime, update_assets);

    // Override the rotational jacobian [Cq] and the rotational residual C,
    // by assuming an additional hidden frame that rotates about frame2:

    if (this->Body1 && this->Body2) {
        ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
        ChFrame<> aframe2 = this->frame2 >> (*this->Body2);

        ChFrame<> aframe12;
        aframe2.TransformParentToLocal(aframe1, aframe12);

        ChFrame<> aframe2rotating;

        double aux_rotation;

        aux_rotation = m_func->Get_y(mytime) + rot_offset;

        aframe2rotating.SetRot(aframe2.GetRot() * Q_from_AngAxis(aux_rotation, VECT_Z));

        ChFrame<> aframe12rotating;
        aframe2rotating.TransformParentToLocal(aframe1, aframe12rotating);

        ChMatrix33<> abs_plane_rotating = aframe2rotating.GetA();

        ChMatrix33<> Jw1 = abs_plane_rotating.transpose() * Body1->GetA();
        ChMatrix33<> Jw2 = -abs_plane_rotating.transpose() * Body2->GetA();

        // Premultiply by Jw1 and Jw2 by  0.5*[Fp(q_resid)]' to get residual as imaginary part of a quaternion.
        ChStarMatrix33<> mtempM(aframe12rotating.GetRot().GetVector() * 0.5);
        mtempM(0, 0) = 0.5 * aframe12rotating.GetRot().e0();
        mtempM(1, 1) = 0.5 * aframe12rotating.GetRot().e0();
        mtempM(2, 2) = 0.5 * aframe12rotating.GetRot().e0();

        ChMatrix33<> mtempQ;
        mtempQ = mtempM.transpose() * Jw1;
        Jw1 = mtempQ;
        mtempQ = mtempM.transpose() * Jw2;
        Jw2 = mtempQ;

        int nc = 0;

        if (c_x) {
            nc++;
        }
        if (c_y) {
            nc++;
        }
        if (c_z) {
            nc++;
        }
        if (c_rx) {
            C(nc) = aframe12rotating.GetRot().e1();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(0);
            nc++;
        }
        if (c_ry) {
            C(nc) = aframe12rotating.GetRot().e2();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(1);
            nc++;
        }
        if (c_rz) {
            C(nc) = aframe12rotating.GetRot().e3();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(2);
            nc++;
        }
    }
}